

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontmetrics.cpp
# Opt level: O2

QRect __thiscall QFontMetrics::boundingRect(QFontMetrics *this,QString *text,QTextOption *option)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long in_FS_OFFSET;
  QRect QVar8;
  undefined1 local_29e8 [12];
  QFixed QStack_29dc;
  undefined1 *local_29d8;
  QStackTextEngine layout;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((text->d).size == 0) {
    uVar7 = 0xffffffffffffffff;
    uVar6 = 0;
  }
  else {
    QFont::QFont((QFont *)local_29e8,(this->d).d.ptr);
    QStackTextEngine::QStackTextEngine(&layout,text,(QFont *)local_29e8);
    QFont::~QFont((QFont *)local_29e8);
    QTextOption::operator=(&layout.super_QTextEngine.option,option);
    QTextEngine::itemize(&layout.super_QTextEngine);
    local_29d8 = &DAT_aaaaaaaaaaaaaaaa;
    local_29e8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xffffffffffffd620 = &DAT_aaaaaaaaaaaaaaaa;
    QTextEngine::boundingBox
              ((glyph_metrics_t *)local_29e8,&layout.super_QTextEngine,0,(int)(text->d).size);
    iVar5 = local_29e8._0_4_ + 0x20 >> 6;
    iVar4 = local_29e8._4_4_ + 0x20 >> 6;
    iVar2 = local_29e8._8_4_ + 0x20;
    iVar3 = QStack_29dc.val + 0x20;
    QStackTextEngine::~QStackTextEngine(&layout);
    uVar6 = CONCAT44(iVar4,iVar5);
    uVar7 = CONCAT44(iVar4 + (iVar3 >> 6) + -1,iVar5 + (iVar2 >> 6) + -1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    QVar8.x2.m_i = (int)uVar7;
    QVar8.y2.m_i = (int)((ulong)uVar7 >> 0x20);
    QVar8.x1.m_i = (int)uVar6;
    QVar8.y1.m_i = (int)((ulong)uVar6 >> 0x20);
    return QVar8;
  }
  __stack_chk_fail();
}

Assistant:

QRect QFontMetrics::boundingRect(const QString &text, const QTextOption &option) const
{
    if (text.size() == 0)
        return QRect();

    Q_DECL_UNINITIALIZED QStackTextEngine layout(text, QFont(d.data()));
    layout.option = option;
    layout.itemize();
    glyph_metrics_t gm = layout.boundingBox(0, text.size());
    return QRect(qRound(gm.x), qRound(gm.y), qRound(gm.width), qRound(gm.height));
}